

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::fuse_convolution_add(NetOptimize *this)

{
  uint _w;
  uint uVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  Layer *pLVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  undefined1 local_78 [48];
  size_type sStack_48;
  int local_40;
  size_t local_38;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar12 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar12 != 0) {
    uVar13 = lVar12 >> 3;
    lVar12 = 0;
    do {
      iVar9 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar12]->type);
      if (iVar9 == 0) {
        uVar11 = lVar12 + 1;
        if (uVar11 < uVar13) {
          iVar9 = *((((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar12]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            iVar10 = std::__cxx11::string::compare
                               ((char *)&(((this->super_ModelWriter).layers)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar11]->type);
            if (((iVar10 == 0) &&
                (pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar11],
                piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar4 == 8)) && (*piVar4 == iVar9))
            goto LAB_00163329;
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar13);
        }
        else {
LAB_00163329:
          if (uVar11 != uVar13) {
            ppLVar5 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar3 = ppLVar5[uVar11];
            if ((*(int *)&pLVar3[1]._vptr_Layer == 0) &&
               (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) == 0)) {
              pLVar6 = ppLVar5[lVar12];
              uVar14 = 0;
LAB_00163374:
              iVar9 = std::__cxx11::string::compare
                                ((char *)&(((this->super_ModelWriter).layers)->
                                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start[uVar14]->type);
              if ((iVar9 != 0) ||
                 (*((((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar14]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start !=
                  *(int *)(*(long *)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>
                                     ._M_impl.super__Vector_impl_data + 4))) goto LAB_001633b5;
              if (uVar11 == uVar14) goto LAB_00163352;
              pLVar7 = (((this->super_ModelWriter).layers)->
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar14];
              _w = *(uint *)&pLVar6[1]._vptr_Layer;
              if ((*(uint *)&pLVar7[1]._vptr_Layer == _w) &&
                 (*(int *)((long)&pLVar7[1]._vptr_Layer + 4) == 0)) {
                iVar9._0_1_ = pLVar7[1].support_bf16_storage;
                iVar9._1_1_ = pLVar7[1].support_fp16_storage;
                iVar9._2_1_ = pLVar7[1].support_int8_storage;
                iVar9._3_1_ = pLVar7[1].support_image_storage;
                bVar15 = iVar9 == 0;
              }
              else {
                bVar15 = false;
              }
              if ((*(uint *)&pLVar7[1]._vptr_Layer == 1) &&
                 (*(int *)((long)&pLVar7[1]._vptr_Layer + 4) == 1)) {
                uVar1._0_1_ = pLVar7[1].support_bf16_storage;
                uVar1._1_1_ = pLVar7[1].support_fp16_storage;
                uVar1._2_1_ = pLVar7[1].support_int8_storage;
                uVar1._3_1_ = pLVar7[1].support_image_storage;
                if (uVar1 != _w && !bVar15) goto LAB_00163352;
              }
              else if (!bVar15) goto LAB_00163352;
              fprintf(_stderr,"fuse_convolution_add %s %s\n",(pLVar6->name)._M_dataplus._M_p);
              ncnn::Mat::reshape((Mat *)local_78,(Mat *)&pLVar7[1].support_tensor_storage,_w,
                                 (Allocator *)0x0);
              if (*(int *)&pLVar6[1].type._M_dataplus._M_p == 0) {
                *(undefined4 *)&pLVar6[1].type._M_dataplus._M_p = 1;
                if (&pLVar6[2].one_blob_only != (bool *)local_78) {
                  if ((int *)local_78._8_8_ != (int *)0x0) {
                    LOCK();
                    *(int *)local_78._8_8_ = *(int *)local_78._8_8_ + 1;
                    UNLOCK();
                  }
                  piVar4 = *(int **)&pLVar6[2].support_tensor_storage;
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (*(long **)&pLVar6[2].typeindex == (long *)0x0) {
                        if (*(void **)&pLVar6[2].one_blob_only != (void *)0x0) {
                          free(*(void **)&pLVar6[2].one_blob_only);
                        }
                      }
                      else {
                        (**(code **)(**(long **)&pLVar6[2].typeindex + 0x18))();
                      }
                    }
                  }
                  pLVar6[2].one_blob_only = (bool)local_78[0];
                  pLVar6[2].support_inplace = (bool)local_78[1];
                  pLVar6[2].support_vulkan = (bool)local_78[2];
                  pLVar6[2].support_packing = (bool)local_78[3];
                  pLVar6[2].support_bf16_storage = (bool)local_78[4];
                  pLVar6[2].support_fp16_storage = (bool)local_78[5];
                  pLVar6[2].support_int8_storage = (bool)local_78[6];
                  pLVar6[2].support_image_storage = (bool)local_78[7];
                  pLVar6[2].support_tensor_storage = (bool)local_78[8];
                  pLVar6[2].support_reserved_00 = (bool)local_78[9];
                  pLVar6[2].support_reserved_0 = (bool)local_78[10];
                  pLVar6[2].support_reserved_1 = (bool)local_78[0xb];
                  pLVar6[2].support_reserved_2 = (bool)local_78[0xc];
                  pLVar6[2].support_reserved_3 = (bool)local_78[0xd];
                  pLVar6[2].support_reserved_4 = (bool)local_78[0xe];
                  pLVar6[2].support_reserved_5 = (bool)local_78[0xf];
                  pLVar6[2].support_reserved_6 = (bool)local_78[0x10];
                  pLVar6[2].support_reserved_7 = (bool)local_78[0x11];
                  pLVar6[2].support_reserved_8 = (bool)local_78[0x12];
                  pLVar6[2].support_reserved_9 = (bool)local_78[0x13];
                  pLVar6[2].support_reserved_10 = (bool)local_78[0x14];
                  pLVar6[2].support_reserved_11 = (bool)local_78[0x15];
                  pLVar6[2].support_reserved_12 = (bool)local_78[0x16];
                  pLVar6[2].support_reserved_13 = (bool)local_78[0x17];
                  *(undefined4 *)&pLVar6[2].userdata = local_78._24_4_;
                  *(undefined8 *)&pLVar6[2].typeindex = local_78._32_8_;
                  pLVar6[2].type._M_dataplus._M_p = (pointer)local_78._40_8_;
                  pLVar6[2].type._M_string_length = sStack_48;
                  *(int *)&pLVar6[2].type.field_2 = local_40;
                  *(size_t *)((long)&pLVar6[2].type.field_2 + 8) = local_38;
                }
              }
              else if (0 < (int)_w) {
                lVar8 = *(long *)&pLVar6[2].one_blob_only;
                uVar11 = 0;
                do {
                  *(float *)(lVar8 + uVar11 * 4) =
                       *(float *)(lVar8 + uVar11 * 4) + *(float *)(local_78._0_8_ + uVar11 * 4);
                  uVar11 = uVar11 + 1;
                } while (_w != uVar11);
              }
              iVar9 = *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              *(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start = iVar9;
              (((this->super_ModelWriter).blobs)->
              super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar9].producer = (int)lVar12;
              std::__cxx11::string::_M_replace
                        ((ulong)&pLVar3->type,0,(char *)(pLVar3->type)._M_string_length,0x52219a);
              if ((int *)local_78._8_8_ != (int *)0x0) {
                LOCK();
                *(int *)local_78._8_8_ = *(int *)local_78._8_8_ + -1;
                UNLOCK();
                if (*(int *)local_78._8_8_ == 0) {
                  if ((Allocator *)local_78._32_8_ == (Allocator *)0x0) {
                    if ((void *)local_78._0_8_ != (void *)0x0) {
                      free((void *)local_78._0_8_);
                    }
                  }
                  else {
                    (*(*(_func_int ***)local_78._32_8_)[3])();
                  }
                }
              }
            }
          }
        }
      }
LAB_00163352:
      lVar12 = lVar12 + 1;
    } while (lVar12 != uVar13 + (uVar13 == 0));
  }
  return 0;
LAB_001633b5:
  uVar14 = uVar14 + 1;
  if (uVar11 == uVar14) goto LAB_00163352;
  goto LAB_00163374;
}

Assistant:

int NetOptimize::fuse_convolution_add()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution")
            continue;

        // Convolution - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse Convolution - BinaryOp to Convolution
        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (binaryop->op_type != 0 || binaryop->with_scalar)
            continue;

        // MemoryData - ..... - BinaryOp
        size_t k = 0;
        for (; k < j; k++)
        {
            if (layers[k]->type != "MemoryData")
                continue;

            if (layers[k]->tops[0] == binaryop->bottoms[1])
                break;
        }

        if (k == j)
            continue;

        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[k];

        int channels = convolution->num_output;

        bool broadcasting_type_ok = false;
        if (memorydata->w == channels && memorydata->h == 0 && memorydata->c == 0)
            broadcasting_type_ok = true;
        if (memorydata->w == 1 && memorydata->h == 1 && memorydata->c == channels)
            broadcasting_type_ok = true;

        if (!broadcasting_type_ok)
        {
            // not bias-like broadcasting type
            continue;
        }

        fprintf(stderr, "fuse_convolution_add %s %s\n", convolution->name.c_str(), binaryop->name.c_str());

        ncnn::Mat bias_data = memorydata->data.reshape(channels);
        {
            if (convolution->bias_term == 0)
            {
                // init bias
                convolution->bias_term = 1;
                convolution->bias_data = bias_data;
            }
            else
            {
                float* bias = convolution->bias_data;
                for (int i = 0; i < channels; i++)
                {
                    bias[i] = bias[i] + bias_data[i];
                }
            }
        }

        int top_blob_index_final = binaryop->tops[0];
        convolution->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        binaryop->type = "ncnnfused";
    }

    return 0;
}